

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapimin.c
# Opt level: O0

boolean jpeg_finish_decompress(j_decompress_ptr cinfo)

{
  int iVar1;
  j_decompress_ptr cinfo_local;
  
  if (((cinfo->global_state == 0xcd) || (cinfo->global_state == 0xce)) &&
     (cinfo->buffered_image == 0)) {
    if (cinfo->output_scanline < cinfo->output_height) {
      cinfo->err->msg_code = 0x45;
      (*cinfo->err->error_exit)((j_common_ptr)cinfo);
    }
    (*cinfo->master->finish_output_pass)(cinfo);
    cinfo->global_state = 0xd2;
  }
  else if (cinfo->global_state == 0xcf) {
    cinfo->global_state = 0xd2;
  }
  else if (cinfo->global_state != 0xd2) {
    cinfo->err->msg_code = 0x15;
    (cinfo->err->msg_parm).i[0] = cinfo->global_state;
    (*cinfo->err->error_exit)((j_common_ptr)cinfo);
  }
  do {
    if (cinfo->inputctl->eoi_reached != 0) {
      (*cinfo->src->term_source)(cinfo);
      jpeg_abort((j_common_ptr)cinfo);
      return 1;
    }
    iVar1 = (*cinfo->inputctl->consume_input)(cinfo);
  } while (iVar1 != 0);
  return 0;
}

Assistant:

GLOBAL(boolean)
jpeg_finish_decompress (j_decompress_ptr cinfo)
{
  if ((cinfo->global_state == DSTATE_SCANNING ||
       cinfo->global_state == DSTATE_RAW_OK) && ! cinfo->buffered_image) {
    /* Terminate final pass of non-buffered mode */
    if (cinfo->output_scanline < cinfo->output_height)
      ERREXIT(cinfo, JERR_TOO_LITTLE_DATA);
    (*cinfo->master->finish_output_pass) (cinfo);
    cinfo->global_state = DSTATE_STOPPING;
  } else if (cinfo->global_state == DSTATE_BUFIMAGE) {
    /* Finishing after a buffered-image operation */
    cinfo->global_state = DSTATE_STOPPING;
  } else if (cinfo->global_state != DSTATE_STOPPING) {
    /* STOPPING = repeat call after a suspension, anything else is error */
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);
  }
  /* Read until EOI */
  while (! cinfo->inputctl->eoi_reached) {
    if ((*cinfo->inputctl->consume_input) (cinfo) == JPEG_SUSPENDED)
      return FALSE;		/* Suspend, come back later */
  }
  /* Do final cleanup */
  (*cinfo->src->term_source) (cinfo);
  /* We can use jpeg_abort to release memory and reset global_state */
  jpeg_abort((j_common_ptr) cinfo);
  return TRUE;
}